

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

LY_ERR lys_compile_unres_dflt
                 (lysc_ctx *ctx,lysc_node *node,lysc_type *type,char *dflt,lysp_module *dflt_pmod,
                 lyd_value *storage,lys_glob_unres *unres)

{
  uint32_t *puVar1;
  lyplg_type_store_clb p_Var2;
  ly_ctx *plVar3;
  size_t sVar4;
  ly_err_item *local_68;
  ly_err_item *err;
  uint32_t options;
  LY_ERR ret;
  lyd_value *storage_local;
  lysp_module *dflt_pmod_local;
  char *dflt_local;
  lysc_type *type_local;
  lysc_node *node_local;
  lysc_ctx *ctx_local;
  
  local_68 = (ly_err_item *)0x0;
  err._0_4_ = 0;
  if ((ctx->ctx->flags & 2) != 0) {
    err._0_4_ = 2;
  }
  p_Var2 = type->plugin->store;
  plVar3 = ctx->ctx;
  _options = storage;
  storage_local = (lyd_value *)dflt_pmod;
  dflt_pmod_local = (lysp_module *)dflt;
  dflt_local = (char *)type;
  type_local = (lysc_type *)node;
  node_local = (lysc_node *)ctx;
  sVar4 = strlen(dflt);
  err._4_4_ = (*p_Var2)(plVar3,type,dflt,sVar4,(uint32_t)err,LY_VALUE_SCHEMA,storage_local,0x3ff,
                        (lysc_node *)type_local,_options,unres,&local_68);
  if (err._4_4_ == LY_ERECOMPILE) {
    ctx_local._4_4_ = LY_ERECOMPILE;
  }
  else {
    if (err._4_4_ == LY_EINCOMPLETE) {
      err._4_4_ = LY_SUCCESS;
    }
    if (err._4_4_ == LY_SUCCESS) {
      LOCK();
      puVar1 = &_options->realtype->refcount;
      *puVar1 = *puVar1 + 1;
      UNLOCK();
      if (_options->realtype->basetype == LY_TYPE_INST) {
        ly_path_free((_options->field_2).target);
        (_options->field_2).dec64 = 0;
      }
      ctx_local._4_4_ = LY_SUCCESS;
    }
    else {
      ly_log_location((lysc_node *)type_local,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
      if (local_68 == (ly_err_item *)0x0) {
        ly_vlog(*(ly_ctx **)node_local,(char *)0x0,LYVE_SEMANTICS,
                "Invalid default - value does not fit the type.");
      }
      else {
        ly_vlog(*(ly_ctx **)node_local,(char *)0x0,LYVE_SEMANTICS,
                "Invalid default - value does not fit the type (%s).",local_68->msg);
        ly_err_free(local_68);
      }
      ly_log_location_revert(1,0,0,0);
      ctx_local._4_4_ = err._4_4_;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lys_compile_unres_dflt(struct lysc_ctx *ctx, struct lysc_node *node, struct lysc_type *type, const char *dflt,
        const struct lysp_module *dflt_pmod, struct lyd_value *storage, struct lys_glob_unres *unres)
{
    LY_ERR ret;
    uint32_t options;
    struct ly_err_item *err = NULL;

    options = (ctx->ctx->flags & LY_CTX_REF_IMPLEMENTED) ? LYPLG_TYPE_STORE_IMPLEMENT : 0;
    ret = type->plugin->store(ctx->ctx, type, dflt, strlen(dflt), options, LY_VALUE_SCHEMA, (void *)dflt_pmod,
            LYD_HINT_SCHEMA, node, storage, unres, &err);
    if (ret == LY_ERECOMPILE) {
        /* fine, but we need to recompile */
        return LY_ERECOMPILE;
    } else if (ret == LY_EINCOMPLETE) {
        /* we have no data so we will not be resolving it */
        ret = LY_SUCCESS;
    }

    if (ret) {
        LOG_LOCSET(node, NULL);
        if (err) {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Invalid default - value does not fit the type (%s).", err->msg);
            ly_err_free(err);
        } else {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Invalid default - value does not fit the type.");
        }
        LOG_LOCBACK(1, 0);
        return ret;
    }

    LY_ATOMIC_INC_BARRIER(((struct lysc_type *)storage->realtype)->refcount);
    if (storage->realtype->basetype == LY_TYPE_INST) {
        /* ly_path includes references to other nodes, in case they are in foreign modules, the context would
         * need to be freed in specific order to avoid accessing freed memory, so just avoid storing it */
        ly_path_free(storage->target);
        storage->target = NULL;
    }
    return LY_SUCCESS;
}